

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O3

void EpdAdd2(EpDouble *epd1,EpDouble *epd2)

{
  int iVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  EpType val;
  
  dVar2 = (epd1->type).value;
  if (((uint)((ulong)dVar2 >> 0x34) < 0xfff || ((ulong)dVar2 & 0xfffffffffffff) != 0x8000000000000)
     && (dVar6 = (epd2->type).value,
        ((ulong)dVar6 & 0xfffffffffffff) != 0x8000000000000 || (ulong)dVar6 < 0xfff0000000000000)) {
    if (ABS(dVar2) == INFINITY) {
      if (ABS(dVar6) == INFINITY) {
        if (-1 < (long)((ulong)dVar6 ^ (ulong)dVar2)) {
          return;
        }
        goto LAB_0081afcf;
      }
    }
    else if (ABS(dVar6) != INFINITY) {
      if (((ulong)dVar2 & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                      ,0x26b,"void EpdAdd2(EpDouble *, EpDouble *)");
      }
      if (((ulong)dVar6 & 0x7ff0000000000000) == 0x3ff0000000000000) {
        iVar3 = epd1->exponent;
        iVar1 = epd2->exponent;
        iVar4 = iVar3 - iVar1;
        if (iVar4 == 0 || iVar3 < iVar1) {
          if (iVar3 < iVar1) {
            iVar4 = iVar1 - iVar3;
            iVar3 = iVar1;
            dVar5 = dVar6;
            if (iVar4 < 0x400) {
              dVar6 = ldexp(1.0,iVar4);
              iVar3 = epd2->exponent;
              dVar5 = dVar2 / dVar6 + (epd2->type).value;
            }
          }
          else {
            dVar5 = dVar6 + dVar2;
          }
        }
        else {
          dVar5 = dVar2;
          if (iVar4 < 0x400) {
            dVar5 = ldexp(1.0,iVar4);
            iVar3 = epd1->exponent;
            dVar5 = dVar6 / dVar5 + dVar2;
          }
        }
        (epd1->type).value = dVar5;
        epd1->exponent = iVar3;
        EpdNormalize(epd1);
        return;
      }
      __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                    ,0x26c,"void EpdAdd2(EpDouble *, EpDouble *)");
    }
    if (ABS(dVar6) == INFINITY) {
      (epd1->type).value = dVar6;
      epd1->exponent = epd2->exponent;
    }
  }
  else {
LAB_0081afcf:
    (epd1->type).value = -NAN;
    epd1->exponent = 0;
  }
  return;
}

Assistant:

void
EpdAdd2(EpDouble *epd1, EpDouble *epd2)
{
  double        value;
  int           exponent, diff;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    if (EpdIsInf(epd1) && EpdIsInf(epd2)) {
      sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
      if (sign == 1)
        EpdMakeNan(epd1);
    } else if (EpdIsInf(epd2)) {
      EpdCopy(epd2, epd1);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  if (epd1->exponent > epd2->exponent) {
    diff = epd1->exponent - epd2->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value +
                epd2->type.value / pow((double)2.0, (double)diff);
    } else
      value = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2->exponent) {
    diff = epd2->exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value / pow((double)2.0, (double)diff) +
                epd2->type.value;
    } else
      value = epd2->type.value;
    exponent = epd2->exponent;
  } else {
    value = epd1->type.value + epd2->type.value;
    exponent = epd1->exponent;
  }
  epd1->type.value = value;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}